

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatred.cpp
# Opt level: O2

void __thiscall
TPZMatRed<float,_TPZVerySparseMatrix<float>_>::TPZMatRed
          (TPZMatRed<float,_TPZVerySparseMatrix<float>_> *this)

{
  TPZMatrix<float>::TPZMatrix(&this->super_TPZMatrix<float>,&PTR_PTR_016a5f08,0,0);
  (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZMatRed_016a5c88;
  TPZAutoPointer<TPZMatrix<float>_>::TPZAutoPointer(&this->fK00);
  TPZAutoPointer<TPZMatrixSolver<float>_>::TPZAutoPointer(&this->fSolver);
  TPZFMatrix<float>::TPZFMatrix(&this->fK11,0,0);
  TPZVerySparseMatrix<float>::TPZVerySparseMatrix(&this->fK01,0,0);
  TPZVerySparseMatrix<float>::TPZVerySparseMatrix(&this->fK10,0,0);
  TPZFMatrix<float>::TPZFMatrix(&this->fF0,0,0);
  TPZFMatrix<float>::TPZFMatrix(&this->fF1,0,0);
  this->fMaxRigidBodyModes = 0;
  this->fNumberRigidBodyModes = 0;
  this->fDim0 = 0;
  this->fDim1 = 0;
  *(undefined4 *)((long)&this->fDim1 + 7) = 0;
  return;
}

Assistant:

TPZMatRed<TVar,  TSideMatrix>::TPZMatRed () : 
TPZRegisterClassId(&TPZMatRed::ClassId),
TPZMatrix<TVar>( 0, 0 ), fK11(0,0),fK01(0,0),fK10(0,0),fF0(0,0),fF1(0,0), fMaxRigidBodyModes(0), fNumberRigidBodyModes(0)
{
	fDim0=0;
	fDim1=0;
	fK01IsComputed = 0;
	fIsReduced = 0;
    fF0IsComputed = false;
}